

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O1

unsigned_long ndiGetBXFrame(ndicapi *pol,int portHandle)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  
  bVar1 = pol->BxHandleCount;
  if (bVar1 == 0) {
    uVar3 = 0;
  }
  else {
    uVar2 = 0;
    do {
      uVar3 = uVar2;
      if (pol->BxHandles[uVar2] == portHandle) break;
      uVar2 = uVar2 + 1;
      uVar3 = (ulong)bVar1;
    } while (bVar1 != uVar2);
  }
  if ((uint)uVar3 != (uint)bVar1) {
    return (ulong)pol->BxFrameNumber[uVar3 & 0xffffffff];
  }
  return 0;
}

Assistant:

ndicapiExport unsigned long ndiGetBXFrame(ndicapi* pol, int portHandle)
{
  int i, n;

  n = pol->BxHandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->BxHandles[i] == portHandle)
    {
      break;
    }
  }
  if (i == n)
  {
    return 0;
  }

  return pol->BxFrameNumber[i];
}